

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void __thiscall ktxValidator::validateDataSize(ktxValidator *this,validationContext *ctx)

{
  long lVar1;
  int *piVar2;
  char *pcVar3;
  long lVar4;
  undefined1 auStack_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  lVar1 = std::istream::tellg();
  std::istream::seekg((long)ctx->inp,_S_beg);
  if (((byte)ctx->inp[*(long *)(*(long *)ctx->inp + -0x18) + 0x20] & 5) != 0) {
    ::issue::issue((issue *)local_58,&IOError.FileSeekEndFailure);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    addIssue<char*>(this,eFatal,(issue *)local_58,pcVar3);
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  lVar4 = std::istream::tellg();
  if (lVar4 < 0) {
    ::issue::issue((issue *)local_80,&IOError.FileTellFailure);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    addIssue<char*>(this,eFatal,(issue *)local_80,pcVar3);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  if (lVar4 - lVar1 != ctx->dataSizeFromLevelIndex) {
    ::issue::issue((issue *)auStack_a8,&FileError.IncorrectDataSize);
    addIssue<>(this,eError,(issue *)auStack_a8);
    std::__cxx11::string::~string((string *)(auStack_a8 + 8));
  }
  return;
}

Assistant:

void
ktxValidator::validateDataSize(validationContext& ctx)
{
    // Expects to be called after validateSgd so current file offset is at
    // the start of the data.
    uint64_t dataSizeInFile;
    off_t dataStart = (off_t)(ctx.inp->tellg());

    ctx.inp->seekg(0, ios_base::end);
    if (ctx.inp->fail())
        addIssue(logger::eFatal, IOError.FileSeekEndFailure,
                 strerror(errno));
    off_t dataEnd = (off_t)(ctx.inp->tellg());
    if (dataEnd < 0)
        addIssue(logger::eFatal, IOError.FileTellFailure, strerror(errno));
    dataSizeInFile = dataEnd - dataStart;
    if (dataSizeInFile != ctx.dataSizeFromLevelIndex)
        addIssue(logger::eError, FileError.IncorrectDataSize);
}